

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_ini_writer::
w_ini_seq<std::vector<xray_re::xr_token,std::allocator<xray_re::xr_token>>,write_ini_token>
          (xr_ini_writer *this,
          vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_> *container)

{
  bool bVar1;
  reference t;
  __normal_iterator<const_xray_re::xr_token_*,_std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>_>
  local_38;
  const_iterator end;
  const_iterator it;
  uint32_t id;
  vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_> *container_local;
  xr_ini_writer *this_local;
  
  it._M_current._4_4_ = 0;
  end = std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::begin(container);
  local_38._M_current =
       (xr_token *)
       std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_38);
    if (!bVar1) break;
    t = __gnu_cxx::
        __normal_iterator<const_xray_re::xr_token_*,_std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>_>
        ::operator*(&end);
    write_ini_token::operator()
              ((write_ini_token *)((long)&this_local + 7),t,this,it._M_current._4_4_);
    __gnu_cxx::
    __normal_iterator<const_xray_re::xr_token_*,_std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>_>
    ::operator++(&end);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  return;
}

Assistant:

inline void xr_ini_writer::w_ini_seq(const T& container, F write)
{
	uint32_t id = 0;
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it, ++id) {
		write(*it, this, id);
	}
}